

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_> *
__thiscall
TgBot::Api::getUpdates
          (vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
           *__return_storage_ptr__,Api *this,int32_t offset,int32_t limit,int32_t timeout,
          StringArrayPtr *allowedUpdates)

{
  bool bVar1;
  int *piVar2;
  element_type *objects;
  allocator local_f1;
  string local_f0;
  ptree local_d0;
  anon_class_1_0_00000001 local_a1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a0;
  undefined1 local_80 [8];
  string allowedUpdatesJson;
  int local_58;
  undefined1 local_48 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  StringArrayPtr *allowedUpdates_local;
  int32_t local_20;
  int32_t timeout_local;
  int32_t limit_local;
  int32_t offset_local;
  Api *this_local;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)allowedUpdates;
  allowedUpdates_local._4_4_ = timeout;
  local_20 = limit;
  timeout_local = offset;
  _limit_local = this;
  this_local = (Api *)__return_storage_ptr__;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48,4);
  if (timeout_local != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[7],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [7])0x47421d,&timeout_local);
  }
  local_58 = 1;
  allowedUpdatesJson.field_2._12_4_ = 100;
  piVar2 = std::min<int>((int *)(allowedUpdatesJson.field_2._M_local_buf + 0xc),&local_20);
  piVar2 = std::max<int>(&stack0xffffffffffffffa8,piVar2);
  local_20 = *piVar2;
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[6],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
             (char (*) [6])0x47ff4e,&local_20);
  if (allowedUpdates_local._4_4_ != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[8],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [8])0x47fdb7,(int *)((long)&allowedUpdates_local + 4));
  }
  bVar1 = std::operator!=((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)args.
                             super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
  if (bVar1) {
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<TgBot::Api::getUpdates(int,int,int,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::__0,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_a0,&local_a1);
    objects = std::
              __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)args.
                             super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    TgTypeParser::parseArray<std::__cxx11::string>
              ((string *)local_80,(TgTypeParser *)&this->field_0x28,&local_a0,objects);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_a0);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [16])"allowed_updates",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::__cxx11::string::~string((string *)local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"getUpdates",&local_f1);
  sendRequest(&local_d0,this,&local_f0,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  TgTypeParser::parseJsonAndGetArray<TgBot::Update>
            (__return_storage_ptr__,(TgTypeParser *)&this->field_0x28,0x34a460,(ptree *)0x0);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

vector<Update::Ptr> Api::getUpdates(int32_t offset, int32_t limit, int32_t timeout, const StringArrayPtr &allowedUpdates) const {
    vector<HttpReqArg> args;
    args.reserve(4);
    if (offset) {
        args.emplace_back("offset", offset);
    }
    limit = max(1, min(100, limit));
    args.emplace_back("limit", limit);
    if (timeout) {
        args.emplace_back("timeout", timeout);
    }
    if (allowedUpdates != nullptr) {
        string allowedUpdatesJson = _tgTypeParser.parseArray<string>(
            [](const string &s)->string {
            return s;
        }, *allowedUpdates);
        args.emplace_back("allowed_updates", allowedUpdatesJson);
    }
    return _tgTypeParser.parseJsonAndGetArray<Update>(&TgTypeParser::parseJsonAndGetUpdate, sendRequest("getUpdates", args));
}